

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O3

CURLcode pre_transfer(GlobalConfig *global,per_transfer *per)

{
  _Bool _Var1;
  int iVar2;
  CURLcode CVar3;
  curl_off_t cVar4;
  curltime cVar5;
  stat fileinfo;
  stat64 sStack_b8;
  
  cVar4 = -1;
  CVar3 = CURLE_OK;
  if ((per->uploadfile != (char *)0x0) &&
     (_Var1 = stdin_upload(per->uploadfile), CVar3 = CURLE_OK, !_Var1)) {
    iVar2 = open64(per->uploadfile,0);
    per->infd = iVar2;
    if ((iVar2 == -1) || (iVar2 = fstat64(iVar2,&sStack_b8), iVar2 != 0)) {
      helpf(tool_stderr,"cannot open \'%s\'",per->uploadfile);
      if (per->infd == -1) {
        return CURLE_READ_ERROR;
      }
      close(per->infd);
      per->infd = 0;
      return CURLE_READ_ERROR;
    }
    per->field_0x1d8 = per->field_0x1d8 | 1;
    CVar3 = CURLE_OK;
    if (sStack_b8.st_size != -1 && (sStack_b8.st_mode & 0xf000) == 0x8000) {
      CVar3 = tool_setopt_offt(per->curl,global,"CURLOPT_INFILESIZE_LARGE",CURLOPT_INFILESIZE_LARGE,
                               sStack_b8.st_size);
      cVar4 = sStack_b8.st_size;
    }
  }
  per->uploadfilesize = cVar4;
  cVar5 = curlx_now();
  (per->start).tv_sec = cVar5.tv_sec;
  (per->start).tv_usec = cVar5.tv_usec;
  return CVar3;
}

Assistant:

static CURLcode pre_transfer(struct GlobalConfig *global,
                             struct per_transfer *per)
{
  curl_off_t uploadfilesize = -1;
  struct_stat fileinfo;
  CURLcode result = CURLE_OK;
#ifdef CURL_DISABLE_LIBCURL_OPTION
  (void)global; /* otherwise used in the my_setopt macros */
#endif

  if(per->uploadfile && !stdin_upload(per->uploadfile)) {
    /* VMS Note:
     *
     * Reading binary from files can be a problem... Only FIXED, VAR
     * etc WITHOUT implied CC will work. Others need a \n appended to
     * a line
     *
     * - Stat gives a size but this is UNRELIABLE in VMS. E.g.
     * a fixed file with implied CC needs to have a byte added for every
     * record processed, this can be derived from Filesize & recordsize
     * for VARiable record files the records need to be counted!  for
     * every record add 1 for linefeed and subtract 2 for the record
     * header for VARIABLE header files only the bare record data needs
     * to be considered with one appended if implied CC
     */
#ifdef __VMS
    /* Calculate the real upload size for VMS */
    per->infd = -1;
    if(stat(per->uploadfile, &fileinfo) == 0) {
      fileinfo.st_size = VmsSpecialSize(uploadfile, &fileinfo);
      switch(fileinfo.st_fab_rfm) {
      case FAB$C_VAR:
      case FAB$C_VFC:
      case FAB$C_STMCR:
        per->infd = open(per->uploadfile, O_RDONLY | CURL_O_BINARY);
        break;
      default:
        per->infd = open(per->uploadfile, O_RDONLY | CURL_O_BINARY,
                         "rfm=stmlf", "ctx=stm");
      }
    }
    if(per->infd == -1)
#else
      per->infd = open(per->uploadfile, O_RDONLY | CURL_O_BINARY);
    if((per->infd == -1) || fstat(per->infd, &fileinfo))
#endif
    {
      helpf(tool_stderr, "cannot open '%s'", per->uploadfile);
      if(per->infd != -1) {
        close(per->infd);
        per->infd = STDIN_FILENO;
      }
      return CURLE_READ_ERROR;
    }
    per->infdopen = TRUE;

    /* we ignore file size for char/block devices, sockets, etc. */
    if(S_ISREG(fileinfo.st_mode))
      uploadfilesize = fileinfo.st_size;

#ifdef DEBUGBUILD
    /* allow dedicated test cases to override */
    {
      char *ev = getenv("CURL_UPLOAD_SIZE");
      if(ev) {
        int sz = atoi(ev);
        uploadfilesize = (curl_off_t)sz;
      }
    }
#endif

    if(uploadfilesize != -1)
      my_setopt_offt(per->curl, CURLOPT_INFILESIZE_LARGE, uploadfilesize);
  }
  per->uploadfilesize = uploadfilesize;
  per->start = curlx_now();
  return result;
}